

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O3

void __thiscall
Assimp::FBX::Node::AddChild<aiMatrix4x4t<float>>(Node *this,string *name,aiMatrix4x4t<float> more)

{
  pointer pcVar1;
  undefined1 local_c8 [32];
  pointer local_a8;
  pointer pFStack_a0;
  pointer local_98;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> vStack_90;
  bool local_78;
  aiMatrix4x4t<float> local_58;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,pcVar1 + name->_M_string_length);
  vStack_90.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_90.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (pointer)0x0;
  vStack_90.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pFStack_a0 = (pointer)0x0;
  local_78 = false;
  local_58.d1 = more.d1;
  local_58.d2 = more.d2;
  local_58.d3 = more.d3;
  local_58.d4 = more.d4;
  local_58.c1 = more.c1;
  local_58.c2 = more.c2;
  local_58.c3 = more.c3;
  local_58.c4 = more.c4;
  local_58.b1 = more.b1;
  local_58.b2 = more.b2;
  local_58.b3 = more.b3;
  local_58.b4 = more.b4;
  local_58.a1 = more.a1;
  local_58.a2 = more.a2;
  local_58.a3 = more.a3;
  local_58.a4 = more.a4;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<aiMatrix4x4t<float>&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&local_a8,&local_58);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_c8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&vStack_90);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector((vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_> *
          )&local_a8);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }